

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_x86_mov64Absolute
               (sysbvm_bytecodeJit_t *jit,sysbvm_x86_register_t destination,uint64_t value)

{
  uint8_t local_2a;
  char local_29;
  uint8_t local_28;
  uint8_t local_27;
  uint8_t local_26;
  uint8_t local_25;
  uint8_t local_24;
  uint8_t local_23;
  uint8_t instruction [10];
  uint64_t value_local;
  sysbvm_x86_register_t destination_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  instruction._2_8_ = value;
  local_2a = sysbvm_jit_x86_rex(true,false,false,SYSBVM_X86_64_ARG0 < destination);
  local_29 = ((byte)destination & 7) + 0xb8;
  local_28 = (uint8_t)instruction._2_8_;
  local_27 = SUB81(instruction._2_8_,1);
  local_26 = SUB81(instruction._2_8_,2);
  local_25 = SUB81(instruction._2_8_,3);
  local_24 = SUB81(instruction._2_8_,4);
  local_23 = SUB81(instruction._2_8_,5);
  instruction[0] = SUB81(instruction._2_8_,6);
  instruction[1] = SUB81(instruction._2_8_,7);
  sysbvm_bytecodeJit_addBytes(jit,10,&local_2a);
  return;
}

Assistant:

static void sysbvm_jit_x86_mov64Absolute(sysbvm_bytecodeJit_t *jit, sysbvm_x86_register_t destination, uint64_t value)
{
    uint8_t instruction[] = {
        sysbvm_jit_x86_rex(true, false, false, destination > SYSBVM_X86_REG_HALF_MASK),
        0xB8 + (destination & SYSBVM_X86_REG_HALF_MASK),
        value & 0xFF, (value >> 8) & 0xFF, (value >> 16) & 0xFF, (value >> 24) & 0xFF,
        (value >> 32) & 0xFF, (value >> 40) & 0xFF, (value >> 48) & 0xFF, (value >> 56) & 0xFF,
    };

    sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
}